

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_matrix.cpp
# Opt level: O3

longdouble * __thiscall
neural_networks::utilities::Neuron::activation_function_prime
          (longdouble *__return_storage_ptr__,Neuron *this,longdouble input)

{
  double __x;
  longdouble *extraout_RAX;
  
  __x = (double)input;
  exp(__x);
  exp(__x);
  exp(__x);
  exp(__x);
  return extraout_RAX;
}

Assistant:

const long double neural_networks::utilities::Neuron::activation_function_prime(const long double input) const {
    return neural_networks::utilities::Neuron::activation_function(input) *
           (1 - neural_networks::utilities::Neuron::activation_function(input));
}